

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Reader * __thiscall
capnp::DynamicValue::Builder::asReader(Reader *__return_storage_ptr__,Builder *this)

{
  bool bVar1;
  undefined2 uVar2;
  char *pcVar3;
  int64_t iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Fault f;
  Fault local_60;
  size_t sStack_58;
  SegmentReader *local_50;
  CapTableReader *pCStack_48;
  byte *local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  switch(this->type) {
  case UNKNOWN:
    __return_storage_ptr__->type = UNKNOWN;
    break;
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar1 = (this->field_1).boolValue;
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = bVar1;
    break;
  case INT:
    iVar4 = (this->field_1).intValue;
    __return_storage_ptr__->type = INT;
    goto LAB_001a561c;
  case UINT:
    iVar4 = (this->field_1).intValue;
    __return_storage_ptr__->type = UINT;
LAB_001a561c:
    (__return_storage_ptr__->field_1).intValue = iVar4;
    break;
  case FLOAT:
    iVar4 = (this->field_1).intValue;
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = iVar4;
    break;
  case TEXT:
    uVar5 = *(undefined4 *)((long)&this->field_1 + 8);
    uVar6 = *(undefined4 *)((long)&this->field_1 + 0xc);
    uVar7 = *(undefined4 *)((long)&this->field_1 + 0x10);
    uVar8 = *(undefined4 *)((long)&this->field_1 + 0x14);
    __return_storage_ptr__->type = TEXT;
    goto LAB_001a565e;
  case DATA:
    uVar5 = *(undefined4 *)&this->field_1;
    uVar6 = *(undefined4 *)((long)&this->field_1 + 4);
    uVar7 = *(undefined4 *)((long)&this->field_1 + 8);
    uVar8 = *(undefined4 *)((long)&this->field_1 + 0xc);
    __return_storage_ptr__->type = DATA;
LAB_001a565e:
    *(undefined4 *)&__return_storage_ptr__->field_1 = uVar5;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 4) = uVar6;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = uVar7;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0xc) = uVar8;
    break;
  case LIST:
    iVar4 = (this->field_1).intValue;
    pcVar3 = (this->field_1).textValue.content.ptr;
    _::ListBuilder::asReader(&(this->field_1).listValue.builder);
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).intValue = iVar4;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ = (size_t)pcVar3;
    (__return_storage_ptr__->field_1).listValue.reader.segment = local_50;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = pCStack_48;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = local_40;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x28) = (undefined4)uStack_38;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x2c) = uStack_38._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x30) = (undefined4)local_30;
    *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 0x34) = local_30._4_2_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_30._6_1_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_30._7_1_;
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.reader.nestingLimit = uStack_28;
    break;
  case ENUM:
    iVar4 = (this->field_1).intValue;
    uVar2 = *(undefined2 *)&(this->field_1).listValue.schema.elementType.field_4;
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).intValue = iVar4;
    *(undefined2 *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar2;
    break;
  case STRUCT:
    iVar4 = (this->field_1).intValue;
    _::StructBuilder::asReader(&(this->field_1).structValue.builder);
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).intValue = iVar4;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ = sStack_58;
    (__return_storage_ptr__->field_1).listValue.reader.segment = local_50;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = pCStack_48;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = local_40;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x28) = (undefined4)uStack_38;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x2c) = uStack_38._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x30) = (undefined4)local_30;
    *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 0x34) = local_30._4_2_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_30._6_1_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_30._7_1_;
    break;
  case CAPABILITY:
    __return_storage_ptr__->type = CAPABILITY;
    (*(code *)(((this->field_1).structValue.builder.segment)->super_SegmentReader).arena[4].
              _vptr_Arena)(&__return_storage_ptr__->field_1);
    (__return_storage_ptr__->field_1).listValue.reader.segment =
         (SegmentReader *)(this->field_1).textValue.content.size_;
    break;
  case ANY_POINTER:
    _::PointerBuilder::asReader((PointerBuilder *)&(this->field_1).textValue);
    __return_storage_ptr__->type = ANY_POINTER;
    break;
  default:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
              (&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x678,FAILED,(char *)0x0,"\"Missing switch case.\"",
               (char (*) [21])"Missing switch case.");
    kj::_::Debug::Fault::fatal(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Reader DynamicValue::Builder::asReader() const {
  switch (type) {
    case UNKNOWN: return Reader();
    case VOID: return Reader(voidValue);
    case BOOL: return Reader(boolValue);
    case INT: return Reader(intValue);
    case UINT: return Reader(uintValue);
    case FLOAT: return Reader(floatValue);
    case TEXT: return Reader(textValue.asReader());
    case DATA: return Reader(dataValue.asReader());
    case LIST: return Reader(listValue.asReader());
    case ENUM: return Reader(enumValue);
    case STRUCT: return Reader(structValue.asReader());
    case CAPABILITY: return Reader(capabilityValue);
    case ANY_POINTER: return Reader(anyPointerValue.asReader());
  }
  KJ_FAIL_ASSERT("Missing switch case.");
  return Reader();
}